

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O2

int __thiscall OpenMD::HBondJumpR::registerHydrogen(HBondJumpR *this,int frame,int hIndex)

{
  pointer pvVar1;
  int iVar2;
  long lVar3;
  int *__x;
  int local_3c;
  int local_38;
  int local_34;
  
  lVar3 = *(long *)&(this->super_HBondJump).GIDtoH_.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[frame].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data;
  iVar2 = *(int *)(lVar3 + (long)hIndex * 4);
  if (iVar2 == -1) {
    pvVar1 = (this->super_HBondJump).hydrogen_.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar2 = (int)((ulong)((long)*(pointer *)
                                 ((long)&pvVar1[frame].super__Vector_base<int,_std::allocator<int>_>
                                         ._M_impl.super__Vector_impl_data + 8) -
                         *(long *)&pvVar1[frame].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data) >> 2);
    *(int *)(lVar3 + (long)hIndex * 4) = iVar2;
    local_38 = hIndex;
    local_34 = frame;
    std::vector<int,_std::allocator<int>_>::push_back(pvVar1 + frame,&local_38);
    local_3c = -1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((this->super_HBondJump).acceptor_.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + frame,&local_3c);
    std::vector<bool,_std::allocator<bool>_>::push_back
              ((this->super_HBondJump).selected_.
               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + frame,false);
    local_3c = -1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((this->rbin_).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + frame,&local_3c);
    if (frame == 0) {
      local_3c = -1;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((this->super_HBondJump).lastAcceptor_.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,&local_3c);
      pvVar1 = (this->super_HBondJump).acceptorStartFrame_.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __x = &local_34;
    }
    else {
      pvVar1 = (this->super_HBondJump).lastAcceptor_.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = (long)*(int *)(*(long *)&(this->super_HBondJump).GIDtoH_.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[frame + -1].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data + (long)local_38 * 4) * 4;
      std::vector<int,_std::allocator<int>_>::push_back
                (pvVar1 + frame,
                 (value_type_conflict2 *)
                 (*(long *)&pvVar1[frame + -1].super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data + lVar3));
      pvVar1 = (this->super_HBondJump).acceptorStartFrame_.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __x = (int *)(lVar3 + *(long *)&pvVar1[(long)frame + -1].
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data);
    }
    std::vector<int,_std::allocator<int>_>::push_back(pvVar1 + frame,__x);
  }
  return iVar2;
}

Assistant:

int HBondJumpR::registerHydrogen(int frame, int hIndex) {
    int index;

    // If this hydrogen wasn't already registered, register it:
    if (GIDtoH_[frame][hIndex] == -1) {
      index = hydrogen_[frame].size();

      GIDtoH_[frame][hIndex] = index;
      hydrogen_[frame].push_back(hIndex);
      acceptor_[frame].push_back(-1);
      selected_[frame].push_back(false);
      rbin_[frame].push_back(-1);

      if (frame == 0) {
        lastAcceptor_[frame].push_back(-1);
        acceptorStartFrame_[frame].push_back(frame);
      } else {
        // Copy the last acceptor.
        int prevIndex = GIDtoH_[frame - 1][hIndex];
        lastAcceptor_[frame].push_back(lastAcceptor_[frame - 1][prevIndex]);
        acceptorStartFrame_[frame].push_back(
            acceptorStartFrame_[frame - 1][prevIndex]);
      }
    } else {
      // This hydrogen was already registered.  Just return the index:
      index = GIDtoH_[frame][hIndex];
    }
    return index;
  }